

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

ostream * rtosc::operator<<(ostream *o,OscDocFormatter *formatter)

{
  ostream *poVar1;
  char buffer [1024];
  
  std::operator<<(o,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  std::operator<<(o,"<osc_unit format_version=\"1.0\">\n");
  std::operator<<(o," <meta>\n");
  poVar1 = std::operator<<(o,"  <name>");
  poVar1 = std::operator<<(poVar1,(string *)&formatter->prog_name);
  std::operator<<(poVar1,"</name>\n");
  poVar1 = std::operator<<(o,"  <uri>");
  poVar1 = std::operator<<(poVar1,(string *)&formatter->uri);
  std::operator<<(poVar1,"</uri>\n");
  poVar1 = std::operator<<(o,"  <doc_origin>");
  poVar1 = std::operator<<(poVar1,(string *)&formatter->doc_origin);
  std::operator<<(poVar1,"</doc_origin>\n");
  poVar1 = std::operator<<(o,"  <author><firstname>");
  std::operator<<(poVar1,(string *)&formatter->author_first);
  poVar1 = std::operator<<(o,"</firstname><lastname>");
  poVar1 = std::operator<<(poVar1,(string *)&formatter->author_last);
  std::operator<<(poVar1,"</lastname></author>\n");
  std::operator<<(o," </meta>\n");
  memset(buffer,0,0x400);
  walk_ports(formatter->p,buffer,0x400,o,dump_ports_cb,false,(void *)0x0,true);
  std::operator<<(o,"</osc_unit>\n");
  return o;
}

Assistant:

std::ostream &rtosc::operator<<(std::ostream &o, rtosc::OscDocFormatter &formatter)
{
    o << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
    o << "<osc_unit format_version=\"1.0\">\n";
    o << " <meta>\n";
    o << "  <name>" << formatter.prog_name << "</name>\n";
    o << "  <uri>" << formatter.uri << "</uri>\n";
    o << "  <doc_origin>" << formatter.doc_origin << "</doc_origin>\n";
    o << "  <author><firstname>" << formatter.author_first;
    o << "</firstname><lastname>" << formatter.author_last << "</lastname></author>\n";
    o << " </meta>\n";
    char buffer[1024];
    memset(buffer, 0, sizeof(buffer));
    walk_ports(formatter.p, buffer, 1024, &o, dump_ports_cb, false, nullptr, true);
    o << "</osc_unit>\n";
    return o;
}